

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pass.cc
# Opt level: O1

void __thiscall
kratos::PassManager::register_pass(PassManager *this,string *name,_func_void_Generator_ptr *fn)

{
  __aligned_membuf<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(kratos::Generator_*)>_>_>
  *__p;
  pointer pcVar1;
  const_iterator cVar2;
  _Link_type __z;
  UserException *this_00;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  pair<std::_Rb_tree_node_base_*,_std::_Rb_tree_node_base_*> pVar3;
  string_view format_str;
  format_args args;
  pointer local_68;
  size_type sStack_60;
  string local_50;
  
  cVar2 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(kratos::Generator_*)>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(kratos::Generator_*)>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(kratos::Generator_*)>_>_>_>
          ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(kratos::Generator_*)>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(kratos::Generator_*)>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(kratos::Generator_*)>_>_>_>
                  *)this,name);
  if ((_Rb_tree_header *)cVar2._M_node != &(this->passes_)._M_t._M_impl.super__Rb_tree_header) {
    this_00 = (UserException *)__cxa_allocate_exception(0x10);
    local_68 = (name->_M_dataplus)._M_p;
    sStack_60 = name->_M_string_length;
    format_str.size_ = 0xd;
    format_str.data_ = (char *)0x26;
    args.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .field_1.args_ = in_R9.args_;
    args.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .desc_ = (unsigned_long_long)&local_68;
    fmt::v7::detail::vformat_abi_cxx11_
              (&local_50,(detail *)"{0} already exists in the pass manager",format_str,args);
    UserException::UserException(this_00,&local_50);
    __cxa_throw(this_00,&UserException::typeinfo,std::runtime_error::~runtime_error);
  }
  __z = (_Link_type)operator_new(0x60);
  __p = &__z->_M_storage;
  *(uchar **)(__z->_M_storage)._M_storage = (__z->_M_storage)._M_storage + 0x10;
  pcVar1 = (name->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>((string *)__p,pcVar1,pcVar1 + name->_M_string_length);
  (__z->_M_storage)._M_storage[0x20] = '\0';
  (__z->_M_storage)._M_storage[0x21] = '\0';
  (__z->_M_storage)._M_storage[0x22] = '\0';
  (__z->_M_storage)._M_storage[0x23] = '\0';
  (__z->_M_storage)._M_storage[0x24] = '\0';
  (__z->_M_storage)._M_storage[0x25] = '\0';
  (__z->_M_storage)._M_storage[0x26] = '\0';
  (__z->_M_storage)._M_storage[0x27] = '\0';
  (__z->_M_storage)._M_storage[0x28] = '\0';
  (__z->_M_storage)._M_storage[0x29] = '\0';
  (__z->_M_storage)._M_storage[0x2a] = '\0';
  (__z->_M_storage)._M_storage[0x2b] = '\0';
  (__z->_M_storage)._M_storage[0x2c] = '\0';
  (__z->_M_storage)._M_storage[0x2d] = '\0';
  (__z->_M_storage)._M_storage[0x2e] = '\0';
  (__z->_M_storage)._M_storage[0x2f] = '\0';
  (__z->_M_storage)._M_storage[0x30] = '\0';
  (__z->_M_storage)._M_storage[0x31] = '\0';
  (__z->_M_storage)._M_storage[0x32] = '\0';
  (__z->_M_storage)._M_storage[0x33] = '\0';
  (__z->_M_storage)._M_storage[0x34] = '\0';
  (__z->_M_storage)._M_storage[0x35] = '\0';
  (__z->_M_storage)._M_storage[0x36] = '\0';
  (__z->_M_storage)._M_storage[0x37] = '\0';
  (__z->_M_storage)._M_storage[0x38] = '\0';
  (__z->_M_storage)._M_storage[0x39] = '\0';
  (__z->_M_storage)._M_storage[0x3a] = '\0';
  (__z->_M_storage)._M_storage[0x3b] = '\0';
  (__z->_M_storage)._M_storage[0x3c] = '\0';
  (__z->_M_storage)._M_storage[0x3d] = '\0';
  (__z->_M_storage)._M_storage[0x3e] = '\0';
  (__z->_M_storage)._M_storage[0x3f] = '\0';
  *(_func_void_Generator_ptr **)((__z->_M_storage)._M_storage + 0x20) = fn;
  *(code **)((__z->_M_storage)._M_storage + 0x38) =
       std::
       _Function_handler<void_(kratos::Generator_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/src/pass.cc:102:17)>
       ::_M_invoke;
  *(code **)((__z->_M_storage)._M_storage + 0x30) =
       std::
       _Function_handler<void_(kratos::Generator_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/src/pass.cc:102:17)>
       ::_M_manager;
  pVar3 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(kratos::Generator_*)>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(kratos::Generator_*)>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(kratos::Generator_*)>_>_>_>
          ::_M_get_insert_unique_pos
                    ((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(kratos::Generator_*)>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(kratos::Generator_*)>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(kratos::Generator_*)>_>_>_>
                      *)this,(key_type *)__p);
  if (pVar3.second != (_Base_ptr)0x0) {
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(kratos::Generator_*)>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(kratos::Generator_*)>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(kratos::Generator_*)>_>_>_>
    ::_M_insert_node((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(kratos::Generator_*)>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(kratos::Generator_*)>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(kratos::Generator_*)>_>_>_>
                      *)this,pVar3.first,pVar3.second,__z);
    return;
  }
  __gnu_cxx::
  new_allocator<std::_Rb_tree_node<std::pair<std::__cxx11::string_const,std::function<void(kratos::Generator*)>>>>
  ::destroy<std::pair<std::__cxx11::string_const,std::function<void(kratos::Generator*)>>>
            ((new_allocator<std::_Rb_tree_node<std::pair<std::__cxx11::string_const,std::function<void(kratos::Generator*)>>>>
              *)this,(pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(kratos::Generator_*)>_>
                      *)__p);
  operator_delete(__z,0x60);
  return;
}

Assistant:

void PassManager::register_pass(const std::string& name, void(fn)(Generator*)) {
    if (has_pass(name))
        throw UserException(::format("{0} already exists in the pass manager", name));
    auto func = [=](Generator* generator) { (*fn)(generator); };
    passes_.emplace(name, func);
}